

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParser.cpp
# Opt level: O0

void skipNonNewlineWhitespace(char **cur,char *end)

{
  char cVar1;
  int c;
  char *end_local;
  char **cur_local;
  
  do {
    if (*cur == end) {
      return;
    }
    cVar1 = **cur;
    if (((cVar1 != ' ') && (cVar1 != '\t')) && (cVar1 != '\r')) {
      if (((cVar1 == '\\') && (*cur + 1 != end)) && ((*cur)[1] == '\n')) {
        *cur = *cur + 1;
      }
      else {
        if (cVar1 != '\\') {
          return;
        }
        if (end <= *cur + 2) {
          return;
        }
        if ((*cur)[1] != '\r') {
          return;
        }
        if ((*cur)[2] != '\n') {
          return;
        }
        *cur = *cur + 2;
      }
    }
    *cur = *cur + 1;
  } while( true );
}

Assistant:

static void skipNonNewlineWhitespace(const char*& cur, const char* end) {
  for (; cur != end; ++cur) {
    int c = *cur;

    // Skip regular whitespace.
    if (c == ' ' || c == '\t' || c == '\r')
      continue;

    // If this is an escaped newline, also skip it.
    if (c == '\\' && cur + 1 != end && cur[1] == '\n') {
      ++cur;
      continue;
    }

    // Also skip \r\n newlines
    if (c == '\\' && cur + 2 < end && cur[1] == '\r' && cur[2] == '\n') {
      cur += 2;
      continue;
    }

    // Otherwise, stop scanning.
    break;
  }
}